

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

void first_pass_tiles(AV1_COMP *cpi,BLOCK_SIZE fp_block_size)

{
  ThreadData *td;
  undefined1 in_SIL;
  long in_RDI;
  TileDataEnc *tile_data;
  int tile_col;
  int tile_row;
  int tile_rows;
  int tile_cols;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined7 in_stack_fffffffffffffff0;
  
  td = (ThreadData *)(in_RDI + 0x3bf80);
  iVar4 = *(int *)(in_RDI + 0x42020);
  iVar3 = *(int *)(in_RDI + 0x42024);
  av1_alloc_src_diff_buf
            ((AV1Common *)CONCAT44(iVar4,iVar3),
             (macroblock *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
    for (iVar1 = 0; iVar1 < iVar4; iVar1 = iVar1 + 1) {
      first_pass_tile((AV1_COMP *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),td,
                      (TileDataEnc *)CONCAT44(iVar4,iVar3),(BLOCK_SIZE)((uint)iVar2 >> 0x18));
    }
  }
  return;
}

Assistant:

static void first_pass_tiles(AV1_COMP *cpi, const BLOCK_SIZE fp_block_size) {
  AV1_COMMON *const cm = &cpi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;

  av1_alloc_src_diff_buf(cm, &cpi->td.mb);
  for (int tile_row = 0; tile_row < tile_rows; ++tile_row) {
    for (int tile_col = 0; tile_col < tile_cols; ++tile_col) {
      TileDataEnc *const tile_data =
          &cpi->tile_data[tile_row * tile_cols + tile_col];
      first_pass_tile(cpi, &cpi->td, tile_data, fp_block_size);
    }
  }
}